

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GetErrorCase::expectError
          (GetErrorCase *this,GLenum error0,GLenum error1)

{
  ostringstream *this_00;
  TestLog *pTVar1;
  int iVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  Enum<int,_2UL> local_1d8;
  Enum<int,_2UL> local_1c8;
  Enum<int,_2UL> local_1b8;
  undefined1 local_1a8 [384];
  
  iVar2 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pTVar1 = ((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
           m_testCtx)->m_log;
  GVar3 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  if (GVar3 != error1 && GVar3 != error0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,"Incorrect error was reported",(allocator<char> *)&local_1d8);
    tcu::ResultCollector::addResult
              (&(this->super_BaseCase).m_results,QP_TEST_RESULT_FAIL,(string *)local_1a8);
    std::__cxx11::string::~string((string *)local_1a8);
    this_00 = (ostringstream *)(local_1a8 + 8);
    local_1d8.m_value = error0;
    local_1a8._0_8_ = pTVar1;
    if (error0 == error1) {
      std::__cxx11::ostringstream::ostringstream(this_00);
      local_1d8.m_getName = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1d8,(ostream *)this_00);
      std::operator<<((ostream *)this_00," was expected but got ");
      local_1c8.m_getName = glu::getErrorName;
      local_1c8.m_value = GVar3;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)this_00);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      std::__cxx11::ostringstream::ostringstream(this_00);
      local_1d8.m_getName = glu::getErrorName;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1d8,(ostream *)this_00);
      std::operator<<((ostream *)this_00," or ");
      local_1c8.m_getName = glu::getErrorName;
      local_1c8.m_value = error1;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)this_00);
      std::operator<<((ostream *)this_00," was expected but got ");
      local_1b8.m_getName = glu::getErrorName;
      local_1b8.m_value = GVar3;
      tcu::Format::Enum<int,_2UL>::toStream(&local_1b8,(ostream *)this_00);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return;
}

Assistant:

void GetErrorCase::expectError (glw::GLenum error0, glw::GLenum error1)
{
	const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
	TestLog&				log		= m_testCtx.getLog();

	const GLenum			result	= gl.getError();

	if (result != error0 && result != error1)
	{
		m_results.addResult(QP_TEST_RESULT_FAIL, "Incorrect error was reported");
		if (error0 == error1)
			log << TestLog::Message
				<< glu::getErrorStr(error0) << " was expected but got "
				<< glu::getErrorStr(result)
				<< TestLog::EndMessage;
		else
			log << TestLog::Message
				<< glu::getErrorStr(error0) << " or "
				<< glu::getErrorStr(error1) << " was expected but got "
				<< glu::getErrorStr(result)
				<< TestLog::EndMessage;
		return;
	}
}